

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

int map_set_(map_base_t *m,char *key,void *value,int vsize)

{
  map_node_t *pmVar1;
  uint uVar2;
  map_node_t **ppmVar3;
  size_t sVar4;
  map_node_t *node;
  map_node_t *pmVar5;
  void *__dest;
  map_node_t **__s;
  long lVar6;
  ulong uVar7;
  map_node_t *node_00;
  bool bVar8;
  
  ppmVar3 = map_getref(m,key);
  if (ppmVar3 == (map_node_t **)0x0) {
    sVar4 = strlen(key);
    uVar2 = (uint)sVar4;
    lVar6 = (long)(int)((~uVar2 & 7) + uVar2 + 1);
    node = (map_node_t *)malloc(lVar6 + 0x18 + (long)vsize);
    if (node == (map_node_t *)0x0) {
LAB_001017ec:
      free(node);
      return -1;
    }
    memcpy(node + 1,key,(long)(int)(uVar2 + 1));
    uVar2 = map_hash(key);
    node->hash = uVar2;
    __dest = (void *)((long)&node[1].hash + lVar6);
    node->value = __dest;
    memcpy(__dest,value,(long)vsize);
    uVar2 = m->nbuckets;
    lVar6 = (long)(int)uVar2;
    if (uVar2 <= m->nnodes) {
      node_00 = (map_node_t *)0x0;
      while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
        pmVar1 = m->buckets[lVar6];
        while (pmVar5 = pmVar1, pmVar5 != (map_node_t *)0x0) {
          pmVar1 = pmVar5->next;
          pmVar5->next = node_00;
          node_00 = pmVar5;
        }
      }
      uVar7 = (ulong)(uVar2 * 2);
      if (uVar2 == 0) {
        uVar7 = 1;
      }
      ppmVar3 = (map_node_t **)realloc(m->buckets,(long)(int)(uint)uVar7 << 3);
      if (ppmVar3 == (map_node_t **)0x0) {
        __s = m->buckets;
        if (__s == (map_node_t **)0x0) goto LAB_001017ec;
        uVar7 = (ulong)m->nbuckets;
      }
      else {
        m->buckets = ppmVar3;
        m->nbuckets = (uint)uVar7;
        __s = ppmVar3;
      }
      memset(__s,0,uVar7 << 3);
      while (node_00 != (map_node_t *)0x0) {
        pmVar1 = node_00->next;
        map_addnode(m,node_00);
        node_00 = pmVar1;
      }
      if (ppmVar3 == (map_node_t **)0x0) goto LAB_001017ec;
    }
    map_addnode(m,node);
    m->nnodes = m->nnodes + 1;
  }
  else {
    memcpy((*ppmVar3)->value,value,(long)vsize);
  }
  return 0;
}

Assistant:

int map_set_(map_base_t *m, const char *key, void *value, int vsize) {
  int n, err;
  map_node_t **next, *node;
  /* Find & replace existing node */
  next = map_getref(m, key);
  if (next) {
    memcpy((*next)->value, value, vsize);
    return 0;
  }
  /* Add new node */
  node = map_newnode(key, value, vsize);
  if (node == NULL) goto fail;
  if (m->nnodes >= m->nbuckets) {
    n = (m->nbuckets > 0) ? (m->nbuckets << 1) : 1;
    err = map_resize(m, n);
    if (err) goto fail;
  }
  map_addnode(m, node);
  m->nnodes++;
  return 0;
  fail:
  if (node) free(node);
  return -1;
}